

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,4u>::copyTo<ImageT<unsigned_int,1u>>
          (ImageT<unsigned_int,4u> *this,ImageT<unsigned_int,_1U> *dst,string_view swizzle)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar2 = (**(code **)(*(long *)this + 0x30))(this,dst,swizzle._M_len);
  iVar3 = (**(code **)(*(long *)dst + 0x30))(dst);
  if (iVar2 != iVar3) {
    __assert_fail("getComponentSize() == dst.getComponentSize()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50a,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 1>]"
                 );
  }
  iVar2 = *(int *)(this + 8);
  if ((iVar2 != *(int *)(dst + 8)) || (iVar3 = *(int *)(this + 0xc), iVar3 != *(int *)(dst + 0xc)))
  {
    __assert_fail("width == dst.getWidth() && height == dst.getHeight()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x50b,
                  "ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::copyTo(DstImage &, std::string_view) [componentType = unsigned int, componentCount = 4, DstImage = ImageT<unsigned int, 1>]"
                 );
  }
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(this + 0x10);
  if (iVar3 * iVar2 != 0) {
    uVar5 = 0;
    do {
      iVar2 = (**(code **)(*(long *)dst + 0x28))(dst);
      uVar7 = 0;
      if (iVar2 != 0) {
        uVar7 = 0;
        do {
          uVar4 = (**(code **)(*(long *)this + 0x28))(this);
          if (uVar4 <= uVar7) break;
          lVar1 = *(long *)(dst + 0x18);
          uVar4 = ImageT<unsigned_int,_4U>::swizzlePixel
                            ((ImageT<unsigned_int,_4U> *)this,
                             (Color *)(*(long *)(this + 0x18) + uVar5 * 0x10),swizzle._M_str[uVar7])
          ;
          *(uint *)(lVar1 + uVar5 * 4) = uVar4;
          uVar7 = uVar7 + 1;
          uVar4 = (**(code **)(*(long *)dst + 0x28))(dst);
        } while (uVar7 < uVar4);
      }
      while( true ) {
        uVar4 = (**(code **)(*(long *)dst + 0x28))(dst);
        uVar6 = (uint)uVar7;
        if (uVar4 <= uVar6) break;
        *(uint *)(*(long *)(dst + 0x18) + uVar5 * 4) = (uVar6 < 3) - 1;
        uVar7 = (ulong)(uVar6 + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (uint)(*(int *)(this + 0xc) * *(int *)(this + 8)));
  }
  return (ImageT<unsigned_int,_4U> *)this;
}

Assistant:

ImageT& copyTo(DstImage& dst, std::string_view swizzle) {
        assert(getComponentSize() == dst.getComponentSize());
        assert(width == dst.getWidth() && height == dst.getHeight());

        dst.setTransferFunction(transferFunction);
        dst.setPrimaries(primaries);
        for (size_t i = 0; i < getPixelCount(); i++) {
            uint32_t c;
            for (c = 0; c < dst.getComponentCount(); c++) {
                if (c < getComponentCount())
                    dst.pixels[i].set(c, swizzlePixel(pixels[i], swizzle[c]));
                else
                    break;
            }
            for (; c < dst.getComponentCount(); c++)
                if (c < 3)
                    dst.pixels[i].set(c, componentType{0});
                else
                    dst.pixels[i].set(c, Color::one());
        }
        return *this;
    }